

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O2

int run_test(int inprocess)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uv_thread_t tid;
  uv_process_t process;
  
  if (inprocess == 0) {
    spawn_helper(&ctx.channel,&process,"ipc_send_recv_helper");
    connect_cb(&ctx.connect_req,0);
  }
  else {
    iVar1 = uv_thread_create(&tid,ipc_send_recv_helper_threadproc,0x2a);
    if (iVar1 != 0) {
      pcVar3 = "r == 0";
      uVar2 = 0xaf;
      goto LAB_001391b5;
    }
    uv_sleep(1000);
    uVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar2,&ctx,1);
    if (iVar1 != 0) {
      pcVar3 = "r == 0";
      uVar2 = 0xb4;
      goto LAB_001391b5;
    }
    uv_pipe_connect(0x2b4438,&ctx,"/tmp/uv-test-sock3",connect_cb);
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if (iVar1 == 0) {
    if (recv_cb_count == 2) {
      iVar1 = 0;
      if (inprocess != 0) {
        iVar1 = uv_thread_join(&tid);
        if (iVar1 != 0) {
          pcVar3 = "r == 0";
          uVar2 = 0xc4;
          goto LAB_001391b5;
        }
      }
      return iVar1;
    }
    pcVar3 = "recv_cb_count == 2";
    uVar2 = 0xc0;
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0xbe;
  }
LAB_001391b5:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static int run_test(int inprocess) {
  uv_process_t process;
  uv_thread_t tid;
  int r;

  if (inprocess) {
    r = uv_thread_create(&tid, ipc_send_recv_helper_threadproc, (void *) 42);
    ASSERT(r == 0);

    uv_sleep(1000);

    r = uv_pipe_init(uv_default_loop(), &ctx.channel, 1);
    ASSERT(r == 0);

    uv_pipe_connect(&ctx.connect_req, &ctx.channel, TEST_PIPENAME_3, connect_cb);
  } else {
    spawn_helper(&ctx.channel, &process, "ipc_send_recv_helper");

    connect_cb(&ctx.connect_req, 0);
  }

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(recv_cb_count == 2);

  if (inprocess) {
    r = uv_thread_join(&tid);
    ASSERT(r == 0);
  }

  return 0;
}